

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_job_queue.c
# Opt level: O0

void * ihevcd_jobq_init(void *pv_buf,WORD32 buf_size)

{
  UWORD32 UVar1;
  int iVar2;
  long lVar3;
  int in_ESI;
  long *in_RDI;
  UWORD8 *pu1_buf;
  jobq_t *ps_jobq;
  long *local_8;
  
  in_RDI[4] = (long)(in_RDI + 6);
  UVar1 = ithread_get_mutex_lock_size();
  lVar3 = (long)(in_RDI + 6) + (ulong)UVar1;
  UVar1 = ithread_get_mutex_lock_size();
  iVar2 = (in_ESI + -0x30) - UVar1;
  if (iVar2 < 1) {
    local_8 = (long *)0x0;
  }
  else {
    ithread_mutex_init((void *)0x133e7a);
    *in_RDI = lVar3;
    in_RDI[1] = lVar3;
    in_RDI[2] = lVar3;
    in_RDI[3] = lVar3 + iVar2;
    *(undefined4 *)(in_RDI + 5) = 0;
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

void* ihevcd_jobq_init(void *pv_buf, WORD32 buf_size)
{
    jobq_t *ps_jobq;
    UWORD8 *pu1_buf;
    pu1_buf = (UWORD8 *)pv_buf;

    ps_jobq = (jobq_t *)pu1_buf;
    pu1_buf += sizeof(jobq_t);
    buf_size -= sizeof(jobq_t);

    ps_jobq->pv_mutex = pu1_buf;
    pu1_buf += ithread_get_mutex_lock_size();
    buf_size -= ithread_get_mutex_lock_size();

    if(buf_size <= 0)
        return NULL;

    ithread_mutex_init(ps_jobq->pv_mutex);

    ps_jobq->pv_buf_base = pu1_buf;
    ps_jobq->pv_buf_wr = pu1_buf;
    ps_jobq->pv_buf_rd = pu1_buf;
    ps_jobq->pv_buf_end = pu1_buf + buf_size;
    ps_jobq->i4_terminate = 0;


    return ps_jobq;
}